

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbarinfo_commands.cpp
# Opt level: O2

void __thiscall
CommandInInventory::ParseNegatable(CommandInInventory *this,FScanner *sc,bool fullScreenOffsets)

{
  bool bVar1;
  PClassActor *ti;
  long lVar2;
  
  bVar1 = FScanner::CheckToken(sc,0x102);
  if (!bVar1) {
    FScanner::MustGetToken(sc,0x101);
  }
  lVar2 = -8;
  do {
    if (lVar2 == 0) {
      return;
    }
    ti = PClass::FindActor(sc->String);
    *(PClassActor **)((long)this->amount + lVar2 * 2) = ti;
    if ((ti == (PClassActor *)0x0) ||
       (bVar1 = PClass::IsAncestorOf(AInventory::RegistrationInfo.MyClass,&ti->super_PClass), !bVar1
       )) {
      FScanner::ScriptMessage(sc,"\'%s\' is not a type of inventory item.",sc->String);
      *(PClass **)((long)this->amount + lVar2 * 2) = AInventory::RegistrationInfo.MyClass;
    }
    bVar1 = FScanner::CheckToken(sc,0x2c);
    if (bVar1) {
      FScanner::MustGetNumber(sc);
      *(int *)((long)this[1].item + lVar2 + -0x38) = sc->Number;
    }
    bVar1 = FScanner::CheckToken(sc,0x11c);
    if (bVar1) {
      this->conditionAnd = false;
    }
    else {
      bVar1 = FScanner::CheckToken(sc,0x11b);
      if (!bVar1) {
        return;
      }
      this->conditionAnd = true;
    }
    bVar1 = FScanner::CheckToken(sc,0x102);
    if (!bVar1) {
      FScanner::MustGetToken(sc,0x101);
    }
    lVar2 = lVar2 + 4;
  } while( true );
}

Assistant:

void	ParseNegatable(FScanner &sc, bool fullScreenOffsets)
		{
			if(!sc.CheckToken(TK_StringConst))
				sc.MustGetToken(TK_Identifier);
			for(int i = 0;i < 2;i++)
			{
				item[i] = PClass::FindActor(sc.String);
				if(item[i] == NULL || !RUNTIME_CLASS(AInventory)->IsAncestorOf(item[i]))
				{
					sc.ScriptMessage("'%s' is not a type of inventory item.", sc.String);
					item[i] = RUNTIME_CLASS(AInventory);
				}
		
				if (sc.CheckToken(','))
				{
					sc.MustGetNumber();
					amount[i] = sc.Number;
				}
		
				if(sc.CheckToken(TK_OrOr))
				{
					conditionAnd = false;
					if(!sc.CheckToken(TK_StringConst))
						sc.MustGetToken(TK_Identifier);
				}
				else if(sc.CheckToken(TK_AndAnd))
				{
					conditionAnd = true;
					if(!sc.CheckToken(TK_StringConst))
						sc.MustGetToken(TK_Identifier);
				}
				else
					break;
			}
		}